

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SelfSelectClient.cpp
# Opt level: O2

void __thiscall xmrig::SelfSelectClient::onHttpData(SelfSelectClient *this,HttpData *data)

{
  undefined8 uVar1;
  bool bVar2;
  int iVar3;
  GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
  *pGVar4;
  undefined4 extraout_var;
  char *pcVar5;
  int64_t id;
  Type result;
  Value *error;
  Document doc;
  
  if (data->status == 200) {
    rapidjson::
    GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
    ::GenericDocument(&doc,(MemoryPoolAllocator<rapidjson::CrtAllocator> *)0x0,0x400,
                      (CrtAllocator *)0x0);
    pGVar4 = rapidjson::
             GenericDocument<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,rapidjson::CrtAllocator>
             ::Parse<0u,rapidjson::UTF8<char>>
                       ((GenericDocument<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,rapidjson::CrtAllocator>
                         *)&doc,(data->body)._M_dataplus._M_p);
    if ((pGVar4->parseResult_).code_ == kParseErrorNone) {
      id = Json::getInt64(&doc.
                           super_GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                          ,"id",-1);
      if ((id < 1) || (this->m_sequence - id == 1)) {
        result = rapidjson::
                 GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                 ::operator[]<char_const>
                           ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                             *)&doc,"result");
        error = Json::getObject(&doc.
                                 super_GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                                ,"error");
        bVar2 = parseResponse(this,id,result,error);
        if (!bVar2) {
          retry(this);
        }
      }
    }
    else {
      if ((this->m_quiet == false) && (this->m_failures < (long)this->m_retries)) {
        iVar3 = (*(this->super_IClient)._vptr_IClient[10])(this);
        uVar1 = *(undefined8 *)(CONCAT44(extraout_var,iVar3) + 0x70);
        pcVar5 = rapidjson::GetParseError_En(doc.parseResult_.code_);
        Log::print(ERR,"[%s] JSON decode failed: \"%s\"",uVar1,pcVar5);
      }
      retry(this);
    }
    rapidjson::
    GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
    ::~GenericDocument(&doc);
    return;
  }
  retry(this);
  return;
}

Assistant:

void xmrig::SelfSelectClient::onHttpData(const HttpData &data)
{
    if (data.status != HTTP_STATUS_OK) {
        return retry();
    }

    LOG_DEBUG("[%s] received (%d bytes): \"%.*s\"", pool().daemon().url().data(), static_cast<int>(data.body.size()), static_cast<int>(data.body.size()), data.body.c_str());

    rapidjson::Document doc;
    if (doc.Parse(data.body.c_str()).HasParseError()) {
        if (!isQuiet()) {
            LOG_ERR("[%s] JSON decode failed: \"%s\"",  pool().daemon().url().data(), rapidjson::GetParseError_En(doc.GetParseError()));
        }

        return retry();
    }

    const int64_t id = Json::getInt64(doc, "id", -1);
    if (id > 0 && m_sequence - id != 1) {
        return;
    }

    if (!parseResponse(id, doc["result"], Json::getObject(doc, "error"))) {
        retry();
    }
}